

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse.cc
# Opt level: O0

bool re2::ParseInteger(StringPiece *s,int *np)

{
  byte bVar1;
  char cVar2;
  int iVar3;
  bool bVar4;
  uint local_28;
  int local_24;
  int c;
  int n;
  int *np_local;
  StringPiece *s_local;
  
  iVar3 = StringPiece::size(s);
  if (iVar3 != 0) {
    bVar1 = StringPiece::operator[](s,0);
    iVar3 = isdigit((uint)bVar1);
    if (iVar3 != 0) {
      iVar3 = StringPiece::size(s);
      if ((1 < iVar3) && (cVar2 = StringPiece::operator[](s,0), cVar2 == '0')) {
        bVar1 = StringPiece::operator[](s,1);
        iVar3 = isdigit((uint)bVar1);
        if (iVar3 != 0) {
          return false;
        }
      }
      local_24 = 0;
      while( true ) {
        iVar3 = StringPiece::size(s);
        bVar4 = false;
        if (0 < iVar3) {
          bVar1 = StringPiece::operator[](s,0);
          local_28 = (uint)bVar1;
          iVar3 = isdigit(local_28);
          bVar4 = iVar3 != 0;
        }
        if (!bVar4) break;
        if (99999999 < local_24) {
          return false;
        }
        local_24 = local_24 * 10 + local_28 + -0x30;
        StringPiece::remove_prefix(s,1);
      }
      *np = local_24;
      return true;
    }
  }
  return false;
}

Assistant:

static bool ParseInteger(StringPiece* s, int* np) {
  if (s->size() == 0 || !isdigit((*s)[0] & 0xFF))
    return false;
  // Disallow leading zeros.
  if (s->size() >= 2 && (*s)[0] == '0' && isdigit((*s)[1] & 0xFF))
    return false;
  int n = 0;
  int c;
  while (s->size() > 0 && isdigit(c = (*s)[0] & 0xFF)) {
    // Avoid overflow.
    if (n >= 100000000)
      return false;
    n = n*10 + c - '0';
    s->remove_prefix(1);  // digit
  }
  *np = n;
  return true;
}